

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O1

ArgIface * __thiscall Args::Command::findChild(Command *this,String *name)

{
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *arg;
  pointer puVar4;
  ArgIface *pAVar3;
  
  do {
    puVar1 = (this->super_GroupIface).m_children.
             super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (this->super_GroupIface).m_children.
                  super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1)
    {
      pAVar3 = (puVar4->_M_t).
               super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
               super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
               super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
      iVar2 = (*pAVar3->_vptr_ArgIface[0xe])(pAVar3,name);
      pAVar3 = (ArgIface *)CONCAT44(extraout_var,iVar2);
      if (pAVar3 != (ArgIface *)0x0) goto LAB_0010425b;
    }
    pAVar3 = (ArgIface *)0x0;
LAB_0010425b:
    if ((pAVar3 != (ArgIface *)0x0) || (this = this->m_subCommand, this == (Command *)0x0)) {
      return pAVar3;
    }
  } while( true );
}

Assistant:

ArgIface * findChild(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & name )
	{
		auto * arg = GroupIface::findArgument( name );

		if( !arg && m_subCommand )
			return m_subCommand->findChild( name );

		return arg;
	}